

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

Point2f __thiscall
pbrt::PortalImageInfiniteLight::ImageFromRender
          (PortalImageInfiniteLight *this,Vector3f *wRender,Float *duv_dw)

{
  undefined8 uVar1;
  float *in_RDX;
  int in_EDI;
  int iVar2;
  float fVar3;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar4;
  double dVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  Vector3f VVar10;
  Float beta;
  Float alpha;
  Vector3f w;
  float x;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffffa8;
  float fVar13;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int high;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_2c;
  undefined4 uStack_28;
  undefined4 local_24;
  undefined8 local_8;
  
  auVar9 = in_ZMM0._8_56_;
  iVar2 = in_EDI + 0x1dc;
  VVar10 = Frame::ToLocal((Frame *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (Vector3f *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  local_24 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  if ((local_24 == 0.0) && (!NAN(local_24))) {
    local_24 = 1e-05;
  }
  uStack_28 = (float)((ulong)uVar1 >> 0x20);
  local_2c = (float)uVar1;
  if (in_RDX != (float *)0x0) {
    auVar6 = vfmadd213ss_fma(ZEXT416((uint)uStack_28),ZEXT416((uint)-uStack_28),
                             SUB6416(ZEXT464(0x3f800000),0));
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)local_2c),ZEXT416((uint)-local_2c),
                             SUB6416(ZEXT464(0x3f800000),0));
    fVar3 = (auVar6._0_4_ * auVar7._0_4_) / local_24;
    std::abs(iVar2);
    *in_RDX = fVar3 * 9.869605;
  }
  fVar3 = -0.0;
  x = -0.0;
  uVar11 = 0x80000000;
  uVar12 = 0x80000000;
  auVar6._0_4_ = local_2c / -local_24;
  auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
  dVar4 = std::atan(auVar6._0_8_);
  auVar7._0_4_ = uStack_28 / (float)((uint)local_24 ^ (uint)fVar3);
  auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
  dVar5 = std::atan(auVar7._0_8_);
  fVar13 = 3.1415927;
  iVar2 = 0;
  high = 1;
  Clamp<float,int,int>((SUB84(dVar4,0) + 1.5707964) / 3.1415927,0,1);
  Clamp<float,int,int>((SUB84(dVar5,0) + 1.5707964) / fVar13,iVar2,high);
  Point2<float>::Point2((Point2<float> *)CONCAT44(uVar12,uVar11),x,fVar3);
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f ImageFromRender(const Vector3f &wRender, Float *duv_dw = nullptr) const {
        Vector3f w = portalFrame.ToLocal(wRender);
        if (w.z == 0)
            w.z = 1e-5;
        if (duv_dw)
            *duv_dw = Pi * Pi * std::abs((1 - w.y * w.y) * (1 - w.x * w.x) / w.z);

        Float alpha = std::atan(w.x / -w.z), beta = std::atan(w.y / -w.z);
        DCHECK(!IsNaN(alpha + beta));
        return Point2f(Clamp((alpha + Pi / 2) / Pi, 0, 1),
                       Clamp((beta + Pi / 2) / Pi, 0, 1));
    }